

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O2

void __thiscall Assimp::FBX::FBXConverter::TransferDataToScene(FBXConverter *this)

{
  aiScene *paVar1;
  aiMesh **__s;
  aiMaterial **__s_00;
  aiAnimation **__s_01;
  aiLight **__s_02;
  aiCamera **__s_03;
  aiTexture **__s_04;
  ulong __n;
  ulong uVar2;
  
  paVar1 = this->out;
  if (paVar1->mMeshes != (aiMesh **)0x0) {
    __assert_fail("!out->mMeshes",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                  ,0xe3a,"void Assimp::FBX::FBXConverter::TransferDataToScene()");
  }
  if (paVar1->mNumMeshes == 0) {
    __n = 0xffffffffffffffff;
    uVar2 = (long)(this->meshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->meshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if (uVar2 != 0) {
      if ((long)uVar2 < 0) {
        uVar2 = __n;
      }
      __s = (aiMesh **)operator_new__(uVar2);
      memset(__s,0,uVar2);
      paVar1->mMeshes = __s;
      this->out->mNumMeshes =
           (uint)((ulong)((long)(this->meshes).
                                super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)(this->meshes).
                               super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 3);
      std::
      swap_ranges<__gnu_cxx::__normal_iterator<aiMesh**,std::vector<aiMesh*,std::allocator<aiMesh*>>>,aiMesh**>
                ((__normal_iterator<aiMesh_**,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>)
                 (this->meshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (__normal_iterator<aiMesh_**,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>)
                 (this->meshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                 super__Vector_impl_data._M_finish,this->out->mMeshes);
    }
    uVar2 = (long)(this->materials).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(this->materials).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    if (uVar2 != 0) {
      if ((long)uVar2 < 0) {
        uVar2 = __n;
      }
      __s_00 = (aiMaterial **)operator_new__(uVar2);
      memset(__s_00,0,uVar2);
      this->out->mMaterials = __s_00;
      this->out->mNumMaterials =
           (uint)((ulong)((long)(this->materials).
                                super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->materials).
                               super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 3);
      std::
      swap_ranges<__gnu_cxx::__normal_iterator<aiMaterial**,std::vector<aiMaterial*,std::allocator<aiMaterial*>>>,aiMaterial**>
                ((__normal_iterator<aiMaterial_**,_std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>_>
                  )(this->materials).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<aiMaterial_**,_std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>_>
                  )(this->materials).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,this->out->mMaterials);
    }
    uVar2 = (long)(this->animations).
                  super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->animations).
                  super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if (uVar2 != 0) {
      if ((long)uVar2 < 0) {
        uVar2 = __n;
      }
      __s_01 = (aiAnimation **)operator_new__(uVar2);
      memset(__s_01,0,uVar2);
      this->out->mAnimations = __s_01;
      this->out->mNumAnimations =
           (uint)((ulong)((long)(this->animations).
                                super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->animations).
                               super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 3);
      std::
      swap_ranges<__gnu_cxx::__normal_iterator<aiAnimation**,std::vector<aiAnimation*,std::allocator<aiAnimation*>>>,aiAnimation**>
                ((__normal_iterator<aiAnimation_**,_std::vector<aiAnimation_*,_std::allocator<aiAnimation_*>_>_>
                  )(this->animations).
                   super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>._M_impl.
                   super__Vector_impl_data._M_start,
                 (__normal_iterator<aiAnimation_**,_std::vector<aiAnimation_*,_std::allocator<aiAnimation_*>_>_>
                  )(this->animations).
                   super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>._M_impl.
                   super__Vector_impl_data._M_finish,this->out->mAnimations);
    }
    uVar2 = (long)(this->lights).super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->lights).super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if (uVar2 != 0) {
      if ((long)uVar2 < 0) {
        uVar2 = __n;
      }
      __s_02 = (aiLight **)operator_new__(uVar2);
      memset(__s_02,0,uVar2);
      this->out->mLights = __s_02;
      this->out->mNumLights =
           (uint)((ulong)((long)(this->lights).
                                super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)(this->lights).
                               super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 3);
      std::
      swap_ranges<__gnu_cxx::__normal_iterator<aiLight**,std::vector<aiLight*,std::allocator<aiLight*>>>,aiLight**>
                ((__normal_iterator<aiLight_**,_std::vector<aiLight_*,_std::allocator<aiLight_*>_>_>
                 )(this->lights).super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
                  super__Vector_impl_data._M_start,
                 (__normal_iterator<aiLight_**,_std::vector<aiLight_*,_std::allocator<aiLight_*>_>_>
                 )(this->lights).super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
                  super__Vector_impl_data._M_finish,this->out->mLights);
    }
    uVar2 = (long)(this->cameras).super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(this->cameras).super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    if (uVar2 != 0) {
      if ((long)uVar2 < 0) {
        uVar2 = __n;
      }
      __s_03 = (aiCamera **)operator_new__(uVar2);
      memset(__s_03,0,uVar2);
      this->out->mCameras = __s_03;
      this->out->mNumCameras =
           (uint)((ulong)((long)(this->cameras).
                                super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)(this->cameras).
                               super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 3);
      std::
      swap_ranges<__gnu_cxx::__normal_iterator<aiCamera**,std::vector<aiCamera*,std::allocator<aiCamera*>>>,aiCamera**>
                ((__normal_iterator<aiCamera_**,_std::vector<aiCamera_*,_std::allocator<aiCamera_*>_>_>
                  )(this->cameras).super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<aiCamera_**,_std::vector<aiCamera_*,_std::allocator<aiCamera_*>_>_>
                  )(this->cameras).super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish,this->out->mCameras);
    }
    uVar2 = (long)(this->textures).super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(this->textures).super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    if (uVar2 != 0) {
      if (-1 < (long)uVar2) {
        __n = uVar2;
      }
      __s_04 = (aiTexture **)operator_new__(__n);
      memset(__s_04,0,__n);
      this->out->mTextures = __s_04;
      this->out->mNumTextures =
           (uint)((ulong)((long)(this->textures).
                                super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->textures).
                               super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>._M_impl
                               .super__Vector_impl_data._M_start) >> 3);
      std::
      swap_ranges<__gnu_cxx::__normal_iterator<aiTexture**,std::vector<aiTexture*,std::allocator<aiTexture*>>>,aiTexture**>
                ((__normal_iterator<aiTexture_**,_std::vector<aiTexture_*,_std::allocator<aiTexture_*>_>_>
                  )(this->textures).super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<aiTexture_**,_std::vector<aiTexture_*,_std::allocator<aiTexture_*>_>_>
                  )(this->textures).super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish,this->out->mTextures);
      return;
    }
    return;
  }
  __assert_fail("!out->mNumMeshes",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                ,0xe3b,"void Assimp::FBX::FBXConverter::TransferDataToScene()");
}

Assistant:

void FBXConverter::TransferDataToScene()
        {
            ai_assert(!out->mMeshes);
            ai_assert(!out->mNumMeshes);

            // note: the trailing () ensures initialization with nullptr - not
            // many C++ users seem to know this, so pointing it out to avoid
            // confusion why this code works.

            if (meshes.size()) {
                out->mMeshes = new aiMesh*[meshes.size()]();
                out->mNumMeshes = static_cast<unsigned int>(meshes.size());

                std::swap_ranges(meshes.begin(), meshes.end(), out->mMeshes);
            }

            if (materials.size()) {
                out->mMaterials = new aiMaterial*[materials.size()]();
                out->mNumMaterials = static_cast<unsigned int>(materials.size());

                std::swap_ranges(materials.begin(), materials.end(), out->mMaterials);
            }

            if (animations.size()) {
                out->mAnimations = new aiAnimation*[animations.size()]();
                out->mNumAnimations = static_cast<unsigned int>(animations.size());

                std::swap_ranges(animations.begin(), animations.end(), out->mAnimations);
            }

            if (lights.size()) {
                out->mLights = new aiLight*[lights.size()]();
                out->mNumLights = static_cast<unsigned int>(lights.size());

                std::swap_ranges(lights.begin(), lights.end(), out->mLights);
            }

            if (cameras.size()) {
                out->mCameras = new aiCamera*[cameras.size()]();
                out->mNumCameras = static_cast<unsigned int>(cameras.size());

                std::swap_ranges(cameras.begin(), cameras.end(), out->mCameras);
            }

            if (textures.size()) {
                out->mTextures = new aiTexture*[textures.size()]();
                out->mNumTextures = static_cast<unsigned int>(textures.size());

                std::swap_ranges(textures.begin(), textures.end(), out->mTextures);
            }
        }